

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fy-token.c
# Opt level: O0

fy_iter_chunk * fy_token_iter_chunk_next(fy_token_iter *iter,fy_iter_chunk *curr,int *errp)

{
  fy_token_iter *local_30;
  int *errp_local;
  fy_iter_chunk *curr_local;
  fy_token_iter *iter_local;
  
  if (iter == (fy_token_iter *)0x0) {
    iter_local = (fy_token_iter *)0x0;
  }
  else {
    if (errp != (int *)0x0) {
      *errp = 0;
    }
    if (curr == (fy_iter_chunk *)0x0) {
      if ((iter->ic).str == (char *)0x0) {
        iter_local = (fy_token_iter *)
                     fy_atom_iter_chunk_next(&iter->atom_iter,(fy_iter_chunk *)0x0,errp);
      }
      else {
        if ((iter->ic).len == 0) {
          local_30 = (fy_token_iter *)0x0;
        }
        else {
          local_30 = (fy_token_iter *)&iter->ic;
        }
        iter_local = local_30;
      }
    }
    else if (curr == &iter->ic) {
      (iter->ic).str = (iter->ic).str + (iter->ic).len;
      (iter->ic).len = 0;
      iter_local = (fy_token_iter *)0x0;
    }
    else {
      iter_local = (fy_token_iter *)fy_atom_iter_chunk_next(&iter->atom_iter,curr,errp);
    }
  }
  return (fy_iter_chunk *)iter_local;
}

Assistant:

const struct fy_iter_chunk *
fy_token_iter_chunk_next(struct fy_token_iter *iter, const struct fy_iter_chunk *curr, int *errp) {
    if (!iter)
        return NULL;

    if (errp)
        *errp = 0;

    /* first time in */
    if (!curr) {
        if (iter->ic.str)
            return iter->ic.len ? &iter->ic : NULL;
        return fy_atom_iter_chunk_next(&iter->atom_iter, NULL, errp);
    }

    /* direct, all consumed */
    if (curr == &iter->ic) {
        iter->ic.str += iter->ic.len;
        iter->ic.len = 0;
        return NULL;
    }

    /* fallback */
    return fy_atom_iter_chunk_next(&iter->atom_iter, curr, errp);
}